

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

LengthData qvariant_cast<QCss::LengthData>(QVariant *v)

{
  bool bVar1;
  QMetaType QVar2;
  LengthData *pLVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  long in_FS_OFFSET;
  LengthData LVar6;
  QMetaType targetType;
  LengthData t;
  QMetaType *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  qreal local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QMetaType::fromType<QCss::LengthData>();
  QVariant::Private::type((Private *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar1 = operator==((QMetaType *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (bVar1) {
    pLVar3 = QVariant::Private::get<QCss::LengthData>((Private *)0xa3f97f);
    local_18 = pLVar3->number;
    local_10 = *(undefined8 *)&pLVar3->unit;
  }
  else {
    memset(&local_18,0,0x10);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0xa3f9bc);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar2.d_ptr,&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    LVar6.unit = (undefined4)local_10;
    LVar6.number = local_18;
    LVar6._12_4_ = 0;
    return LVar6;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}